

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcSetModuleFunctionAttribute(char *module,char *name,int index,uint attribute,uint value)

{
  ExternFuncInfo *pEVar1;
  uint uVar2;
  uint local_44;
  uint attributeBit;
  ExternFuncInfo *fInfo;
  byte local_28;
  uint value_local;
  uint attribute_local;
  int index_local;
  char *name_local;
  char *module_local;
  
  pEVar1 = nullcFindModuleFunction(module,name,index);
  if (pEVar1 == (ExternFuncInfo *)0x0) {
    module_local._7_1_ = '\0';
  }
  else {
    local_28 = (byte)attribute;
    local_44 = 1 << (local_28 & 0x1f);
    if (attribute == 0) {
      uVar2 = local_44 ^ 0xffffffff;
      if (value == 0) {
        local_44 = 0;
      }
      pEVar1->attributes = pEVar1->attributes & uVar2 | local_44;
      module_local._7_1_ = '\x01';
    }
    else {
      NULLC::nullcLastError = "ERROR: unknown function attribute";
      module_local._7_1_ = '\0';
    }
  }
  return module_local._7_1_;
}

Assistant:

nullres nullcSetModuleFunctionAttribute(const char* module, const char* name, int index, unsigned attribute, unsigned value)
{
	using namespace NULLC;

	if(ExternFuncInfo *fInfo = nullcFindModuleFunction(module, name, index))
	{
		unsigned attributeBit = 1 << attribute;

		switch(attribute)
		{
		case NULLC_ATTRIBUTE_NO_MEMORY_WRITE:
			fInfo->attributes = (fInfo->attributes & ~attributeBit) | (value != 0 ? attributeBit : 0);
			break;
		default:
			nullcLastError = "ERROR: unknown function attribute";
			return false;
		}

		return true;
	}

	return false;
}